

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall
SQCompilation::CodegenVisitor::visitContinueStatement
          (CodegenVisitor *this,ContinueStatement *continueStmt)

{
  uint uVar1;
  size_type sVar2;
  SQInteger SVar3;
  long *p;
  uint uVar4;
  long lVar5;
  SQFuncState *pSVar6;
  ulong uVar7;
  SQInstruction local_20;
  
  lVar5 = (long)(continueStmt->super_JumpStatement).super_Statement.super_Node._coordinates.
                lineStart;
  if (lVar5 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar5,this->_lineinfo,false);
  }
  pSVar6 = this->_fs;
  sVar2 = (pSVar6->_continuetargets)._size;
  if (sVar2 == 0) {
    reportDiagnostic(this,(Node *)continueStmt,0x26,"continue");
    pSVar6 = this->_fs;
    sVar2 = (pSVar6->_continuetargets)._size;
  }
  lVar5 = (pSVar6->_continuetargets)._vals[sVar2 - 1];
  if (0 < lVar5) {
    local_20._arg0 = (uchar)lVar5;
    local_20._0_5_ = 0x4300000000;
    local_20 = (SQInstruction)((ulong)local_20._4_2_ << 0x20);
    SQFuncState::AddInstruction(pSVar6,&local_20);
    pSVar6 = this->_fs;
  }
  SVar3 = SQFuncState::GetStackSize(pSVar6);
  pSVar6 = this->_fs;
  lVar5 = (pSVar6->_blockstacksizes)._vals[(pSVar6->_blockstacksizes)._size - 1];
  if (SVar3 != lVar5) {
    SVar3 = SQFuncState::CountOuters(pSVar6,lVar5);
    pSVar6 = this->_fs;
    if (SVar3 != 0) {
      local_20.op = 'G';
      local_20._arg0 = '\0';
      local_20._arg2 = '\0';
      local_20._arg3 = '\0';
      local_20.field_0._arg1 =
           ((anon_union_4_2_91d81cc7_for_SQInstruction_0 *)
           ((pSVar6->_blockstacksizes)._vals + ((pSVar6->_blockstacksizes)._size - 1)))->_arg1;
      SQFuncState::AddInstruction(pSVar6,&local_20);
      pSVar6 = this->_fs;
    }
  }
  local_20.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0xfffffb2e;
  local_20.op = '\"';
  local_20._arg0 = '\0';
  local_20._arg2 = '\0';
  local_20._arg3 = '\0';
  SQFuncState::AddInstruction(pSVar6,&local_20);
  pSVar6 = this->_fs;
  sVar2 = (pSVar6->_instructions)._size;
  uVar1 = (pSVar6->_unresolvedcontinues)._allocated;
  uVar4 = (pSVar6->_unresolvedcontinues)._size;
  p = (pSVar6->_unresolvedcontinues)._vals;
  if (uVar1 <= uVar4) {
    uVar7 = 4;
    if (uVar4 * 2 != 0) {
      uVar7 = (ulong)(uVar4 * 2);
    }
    p = (long *)sq_vm_realloc((pSVar6->_unresolvedcontinues)._alloc_ctx,p,(ulong)uVar1 << 3,
                              uVar7 * 8);
    (pSVar6->_unresolvedcontinues)._vals = p;
    (pSVar6->_unresolvedcontinues)._allocated = (size_type)uVar7;
    uVar4 = (pSVar6->_unresolvedcontinues)._size;
  }
  (pSVar6->_unresolvedcontinues)._size = uVar4 + 1;
  p[uVar4] = (ulong)(sVar2 - 1);
  return;
}

Assistant:

void CodegenVisitor::visitContinueStatement(ContinueStatement *continueStmt) {
    addLineNumber(continueStmt);
    if (_fs->_continuetargets.size() <= 0)
        reportDiagnostic(continueStmt, DiagnosticsId::DI_LOOP_CONTROLLER_NOT_IN_LOOP, "continue");
    if (_fs->_continuetargets.top() > 0) {
        _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
    }
    RESOLVE_OUTERS();
    _fs->AddInstruction(_OP_JMP, 0, -1234);
    _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
}